

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O1

int ImfCloseInputFile(ImfInputFile *in)

{
  if (in != (ImfInputFile *)0x0) {
    (**(code **)(*(long *)in + 8))();
  }
  return 1;
}

Assistant:

int
ImfCloseInputFile (ImfInputFile* in)
{
    try
    {
        delete infile (in);
        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}